

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peak_event.c
# Opt level: O2

void peak_event_activity_callback(tsd_t *tsd)

{
  activity_callback_t UNRECOVERED_JUMPTABLE;
  
  UNRECOVERED_JUMPTABLE =
       (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_activity_callback_thunk).callback
  ;
  if (UNRECOVERED_JUMPTABLE != (activity_callback_t)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_activity_callback_thunk).
               uctx,tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated,
               tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated);
    return;
  }
  return;
}

Assistant:

static void
peak_event_activity_callback(tsd_t *tsd) {
	activity_callback_thunk_t *thunk = tsd_activity_callback_thunkp_get(
	    tsd);
	uint64_t alloc = tsd_thread_allocated_get(tsd);
	uint64_t dalloc = tsd_thread_deallocated_get(tsd);
	if (thunk->callback != NULL) {
		thunk->callback(thunk->uctx, alloc, dalloc);
	}
}